

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::createMesh(ObjFileParser *this,string *meshName)

{
  bool bVar1;
  Mesh *this_00;
  pointer pMVar2;
  pointer pMVar3;
  size_type sVar4;
  Logger *this_01;
  value_type_conflict2 local_28 [2];
  uint meshId;
  string *local_18;
  string *meshName_local;
  ObjFileParser *this_local;
  
  local_18 = meshName;
  meshName_local = (string *)this;
  bVar1 = std::operator!=((nullptr_t)0x0,&this->m_pModel);
  if (!bVar1) {
    __assert_fail("__null != m_pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileParser.cpp"
                  ,0x33d,"void Assimp::ObjFileParser::createMesh(const std::string &)");
  }
  this_00 = (Mesh *)operator_new(0x70);
  ObjFile::Mesh::Mesh(this_00,local_18);
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  pMVar2->m_pCurrentMesh = this_00;
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::push_back
            (&pMVar2->m_Meshes,&pMVar3->m_pCurrentMesh);
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  sVar4 = std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::size
                    (&pMVar2->m_Meshes);
  local_28[0] = (int)sVar4 - 1;
  pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  if (pMVar2->m_pCurrent == (Object *)0x0) {
    this_01 = DefaultLogger::get();
    Logger::error(this_01,"OBJ: No object detected to attach a new mesh instance.");
  }
  else {
    pMVar2 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&pMVar2->m_pCurrent->m_Meshes,local_28);
  }
  return;
}

Assistant:

void ObjFileParser::createMesh( const std::string &meshName )
{
    ai_assert( NULL != m_pModel );
    m_pModel->m_pCurrentMesh = new ObjFile::Mesh( meshName );
    m_pModel->m_Meshes.push_back( m_pModel->m_pCurrentMesh );
    unsigned int meshId = static_cast<unsigned int>(m_pModel->m_Meshes.size()-1);
    if ( NULL != m_pModel->m_pCurrent )
    {
        m_pModel->m_pCurrent->m_Meshes.push_back( meshId );
    }
    else
    {
        ASSIMP_LOG_ERROR("OBJ: No object detected to attach a new mesh instance.");
    }
}